

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase358::run(TestCase358 *this)

{
  StructSchema SVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  Type TVar5;
  Schema SVar6;
  Maybe<capnp::StructSchema::Field> *pMVar7;
  uint uVar8;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StructSchema schema;
  Builder root;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_2;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_1;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  MallocMessageBuilder builder;
  StructSchema local_ae0;
  Builder local_ad8;
  Reader local_aa8;
  undefined1 local_a60 [408];
  None *local_8c8;
  char *local_8c0;
  size_t local_8b8;
  bool local_8b0;
  undefined1 local_8a8 [416];
  undefined1 local_708 [8];
  undefined1 auStack_700 [400];
  Reader local_570;
  uint local_528;
  uint uStack_524;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined7 local_508;
  undefined1 uStack_501;
  undefined7 uStack_500;
  undefined1 uStack_4f9;
  undefined4 local_4f8;
  undefined3 uStack_4f4;
  ArrayDisposer *pAStack_4e9;
  Builder local_390;
  Reader local_350;
  Reader local_318;
  Reader local_2e0;
  Reader local_2a8;
  Builder local_270;
  Builder local_230;
  Builder local_1f0;
  Reader local_1b0;
  Reader local_168;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  local_ae0.super_Schema.raw = (Schema)((long)schemas::s_9e2e784c915329b6 + 0x48);
  MessageBuilder::getRootInternal((Builder *)local_a60,&local_120.super_MessageBuilder);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_ad8,
             (EVP_PKEY_CTX *)(schemas::s_9e2e784c915329b6 + 0x48));
  name.content.size_ = 4;
  name.content.ptr = "foo";
  uVar8 = 4;
  StructSchema::getFieldByName((Field *)local_8a8,&local_ae0,name);
  uVar3 = local_8a8._8_4_;
  uVar2 = local_8a8._0_8_;
  local_518._4_4_ = local_8a8._32_4_;
  local_518._0_4_ = local_8a8._28_4_;
  uStack_510._4_4_ = local_8a8._40_4_;
  uStack_510._0_4_ = local_8a8._36_4_;
  local_508 = (undefined7)CONCAT44(local_8a8._48_4_,local_8a8._44_4_);
  uStack_501 = SUB41(local_8a8._48_4_,3);
  uStack_500 = (undefined7)CONCAT44(local_8a8._56_4_,local_8a8._52_4_);
  uStack_4f9 = SUB41(local_8a8._56_4_,3);
  local_4f8 = local_8a8._60_4_;
  local_a60._64_8_ =
       DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_708,&local_ad8);
  local_a60._72_4_ = uVar8;
  if ((bool)local_708[0] == true) {
    local_aa8._4_4_ = auStack_700._16_4_;
    local_aa8.type = auStack_700._12_4_;
    local_aa8.field_1.intValue = CONCAT44(auStack_700._24_4_,auStack_700._20_4_);
    local_aa8.field_1.textValue.super_StringPtr.content.size_ =
         CONCAT44(auStack_700._32_4_,auStack_700._28_4_);
    local_aa8.field_1.capabilityValue.schema.super_Schema.raw =
         (InterfaceSchema)CONCAT44(auStack_700._40_4_,auStack_700._36_4_);
    local_aa8.field_1.listValue.reader.capTable =
         (CapTableReader *)CONCAT44(auStack_700._48_4_,auStack_700._44_4_);
    local_aa8.field_1.listValue.reader.ptr = (byte *)CONCAT44(auStack_700._56_4_,auStack_700._52_4_)
    ;
    local_aa8.field_1.listValue.reader.elementCount = auStack_700._60_4_;
    local_a60._64_8_ = auStack_700._0_8_;
    local_a60._72_4_ = auStack_700._8_4_;
  }
  if ((bool)local_708[0] == false) {
    local_570.type = UNKNOWN;
    local_570._4_4_ = 0;
    local_708 = (undefined1  [8])0x0;
    auStack_700._0_8_ = (Schema)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_570,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_570);
  }
  local_a60._124_4_ = local_aa8.field_1.listValue.reader.elementCount;
  local_a60._108_8_ = local_aa8.field_1.listValue.reader.capTable;
  local_a60._116_8_ = local_aa8.field_1.listValue.reader.ptr;
  local_a60._92_8_ = local_aa8.field_1.textValue.super_StringPtr.content.size_;
  local_a60._100_8_ = local_aa8.field_1.listValue.reader.segment;
  local_a60._76_8_ = local_aa8._0_8_;
  local_a60._84_8_ = local_aa8.field_1.intValue;
  local_a60._0_8_ = uVar2;
  local_a60._8_4_ = uVar3;
  local_a60[0x33] = uStack_501;
  local_a60._44_7_ = local_508;
  local_a60[0x3b] = uStack_4f9;
  local_a60._52_7_ = uStack_500;
  local_a60._28_8_ = local_518;
  local_a60._36_8_ = uStack_510;
  local_a60._60_4_ = local_4f8;
  local_a60._128_8_ = " == ";
  local_a60._136_8_ = &DAT_00000005;
  local_a60[0x90] = uVar3 == local_a60._72_4_ && uVar2 == local_a60._64_8_;
  if ((uVar3 != local_a60._72_4_ || uVar2 != local_a60._64_8_) && (kj::_::Debug::minSeverity < 3)) {
    name_00.content.size_ = 4;
    name_00.content.ptr = "foo";
    StructSchema::getFieldByName((Field *)&local_aa8,&local_ae0,name_00);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8a8,&local_ad8);
    if (local_8a8[0] != true) {
      local_570.type = UNKNOWN;
      local_570._4_4_ = 0;
      local_8a8._0_8_ = (RawBrandedSchema *)0x0;
      local_8a8._8_4_ = 0;
      local_8a8._12_4_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_570,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_570);
    }
    auStack_700._4_4_ = local_8a8._12_4_;
    auStack_700._0_4_ = local_8a8._8_4_;
    pAStack_4e9 = (ArrayDisposer *)local_8a8._64_8_;
    uStack_501 = (undefined1)local_8a8._40_4_;
    uStack_500 = (undefined7)(CONCAT44(local_8a8._44_4_,local_8a8._40_4_) >> 8);
    uStack_4f9 = (undefined1)local_8a8._48_4_;
    local_4f8 = (undefined4)(CONCAT44(local_8a8._52_4_,local_8a8._48_4_) >> 8);
    uStack_4f4 = SUB43(local_8a8._52_4_,1);
    local_708[0] = true;
    auStack_700._8_4_ = local_8a8._16_4_;
    auStack_700._12_4_ = local_8a8._20_4_;
    auStack_700._16_4_ = local_8a8._24_4_;
    auStack_700._20_4_ = local_8a8._28_4_;
    auStack_700._24_4_ = local_8a8._32_4_;
    auStack_700._28_4_ = local_8a8._36_4_;
    auStack_700._32_4_ = local_8a8._40_4_;
    auStack_700._36_4_ = local_8a8._44_4_;
    auStack_700._40_4_ = local_8a8._48_4_;
    auStack_700._44_4_ = local_8a8._52_4_;
    auStack_700._48_4_ = local_8a8._56_4_;
    auStack_700._52_4_ = local_8a8._60_4_;
    auStack_700._56_4_ = (undefined4)local_8a8._64_8_;
    auStack_700._60_4_ = SUB84(local_8a8._64_8_,4);
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16b,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 363, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 363, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 363, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_a60
               ,(Field *)&local_aa8,(Field *)auStack_700);
  }
  local_a60._0_4_ = 3;
  local_a60._8_4_ = 0x141;
  local_a60._12_4_ = 0;
  name_33.content.size_ = 4;
  name_33.content.ptr = "bar";
  DynamicStruct::Builder::set(&local_ad8,name_33,(Reader *)local_a60);
  DynamicValue::Reader::~Reader((Reader *)local_a60);
  name_01.content.size_ = 4;
  name_01.content.ptr = "bar";
  uVar8 = 4;
  StructSchema::getFieldByName((Field *)local_8a8,&local_ae0,name_01);
  uVar2 = local_8a8._0_8_;
  local_528 = local_8a8._12_4_;
  local_518._4_4_ = local_8a8._32_4_;
  local_518._0_4_ = local_8a8._28_4_;
  uStack_510._4_4_ = local_8a8._40_4_;
  uStack_510._0_4_ = local_8a8._36_4_;
  local_508 = (undefined7)CONCAT44(local_8a8._48_4_,local_8a8._44_4_);
  uStack_501 = SUB41(local_8a8._48_4_,3);
  uStack_500 = (undefined7)CONCAT44(local_8a8._56_4_,local_8a8._52_4_);
  uStack_4f9 = SUB41(local_8a8._56_4_,3);
  local_4f8 = local_8a8._60_4_;
  SVar6.raw = (RawBrandedSchema *)
              DynamicStruct::Builder::which
                        ((Maybe<capnp::StructSchema::Field> *)local_708,&local_ad8);
  if ((bool)local_708[0] == true) {
    local_aa8._4_4_ = auStack_700._16_4_;
    local_aa8.type = auStack_700._12_4_;
    local_aa8.field_1.intValue = CONCAT44(auStack_700._24_4_,auStack_700._20_4_);
    local_aa8.field_1.textValue.super_StringPtr.content.size_ =
         CONCAT44(auStack_700._32_4_,auStack_700._28_4_);
    local_aa8.field_1.capabilityValue.schema.super_Schema.raw =
         (InterfaceSchema)CONCAT44(auStack_700._40_4_,auStack_700._36_4_);
    local_aa8.field_1.listValue.reader.capTable =
         (CapTableReader *)CONCAT44(auStack_700._48_4_,auStack_700._44_4_);
    local_aa8.field_1.listValue.reader.ptr = (byte *)CONCAT44(auStack_700._56_4_,auStack_700._52_4_)
    ;
    local_aa8.field_1.listValue.reader.elementCount = auStack_700._60_4_;
    SVar6.raw = (RawBrandedSchema *)auStack_700._0_8_;
    uVar8 = auStack_700._8_4_;
  }
  if ((bool)local_708[0] == false) {
    local_570.type = UNKNOWN;
    local_570._4_4_ = 0;
    local_708 = (undefined1  [8])0x0;
    auStack_700._0_8_ = (Schema)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_570,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_570);
  }
  local_a60._124_4_ = local_aa8.field_1.listValue.reader.elementCount;
  local_a60._108_8_ = local_aa8.field_1.listValue.reader.capTable;
  local_a60._116_8_ = local_aa8.field_1.listValue.reader.ptr;
  local_a60._92_8_ = local_aa8.field_1.textValue.super_StringPtr.content.size_;
  local_a60._100_8_ = local_aa8.field_1.listValue.reader.segment;
  local_a60._76_8_ = local_aa8._0_8_;
  local_a60._84_8_ = local_aa8.field_1.intValue;
  local_a60._0_8_ = uVar2;
  local_a60._8_4_ = local_8a8._8_4_;
  local_a60[0x33] = uStack_501;
  local_a60._44_7_ = local_508;
  local_a60[0x3b] = uStack_4f9;
  local_a60._52_7_ = uStack_500;
  local_a60._28_8_ = local_518;
  local_a60._36_8_ = uStack_510;
  local_a60._60_4_ = local_4f8;
  local_a60._128_8_ = " == ";
  local_a60._136_8_ = &DAT_00000005;
  local_a60[0x90] = local_8a8._8_4_ == uVar8 && (RawBrandedSchema *)uVar2 == SVar6.raw;
  local_a60._64_8_ = SVar6.raw;
  local_a60._72_4_ = uVar8;
  if ((local_8a8._8_4_ != uVar8 || (RawBrandedSchema *)uVar2 != SVar6.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    name_02.content.size_ = 4;
    name_02.content.ptr = "bar";
    StructSchema::getFieldByName((Field *)&local_aa8,&local_ae0,name_02);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8a8,&local_ad8);
    if (local_8a8[0] != true) {
      local_570.type = UNKNOWN;
      local_570._4_4_ = 0;
      local_8a8._0_8_ = (RawBrandedSchema *)0x0;
      local_8a8._8_4_ = 0;
      local_8a8._12_4_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_570,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_570);
    }
    pAStack_4e9 = (ArrayDisposer *)local_8a8._64_8_;
    uStack_501 = (undefined1)local_8a8._40_4_;
    uStack_500 = (undefined7)(CONCAT44(local_8a8._44_4_,local_8a8._40_4_) >> 8);
    uStack_4f9 = (undefined1)local_8a8._48_4_;
    local_4f8 = (undefined4)(CONCAT44(local_8a8._52_4_,local_8a8._48_4_) >> 8);
    uStack_4f4 = SUB43(local_8a8._52_4_,1);
    local_708[0] = true;
    auStack_700._16_4_ = local_8a8._24_4_;
    auStack_700._20_4_ = local_8a8._28_4_;
    auStack_700._24_4_ = local_8a8._32_4_;
    auStack_700._28_4_ = local_8a8._36_4_;
    auStack_700._32_4_ = local_8a8._40_4_;
    auStack_700._36_4_ = local_8a8._44_4_;
    auStack_700._40_4_ = local_8a8._48_4_;
    auStack_700._44_4_ = local_8a8._52_4_;
    auStack_700._48_4_ = local_8a8._56_4_;
    auStack_700._52_4_ = local_8a8._60_4_;
    auStack_700._56_4_ = (undefined4)local_8a8._64_8_;
    auStack_700._60_4_ = SUB84(local_8a8._64_8_,4);
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16e,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"bar\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 366, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"bar\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 366, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"bar\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 366, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_a60
               ,(Field *)&local_aa8,(Field *)auStack_700);
  }
  name_03.content.size_ = 4;
  name_03.content.ptr = "bar";
  DynamicStruct::Builder::get((Builder *)local_a60,&local_ad8,name_03);
  local_708._4_4_ =
       DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)local_a60);
  local_708._0_4_ = 0x141;
  auStack_700._0_8_ = " == ";
  auStack_700._8_4_ = 5;
  auStack_700._12_4_ = 0;
  auStack_700[0x10] = local_708._4_4_ == 0x141;
  DynamicValue::Builder::~Builder((Builder *)local_a60);
  if ((auStack_700[0x10] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_8a8._0_4_ = 0x141;
    name_04.content.size_ = 4;
    name_04.content.ptr = "bar";
    DynamicStruct::Builder::get((Builder *)local_a60,&local_ad8,name_04);
    local_528 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                          ((Builder *)local_a60);
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16f,ERROR,
               "\"failed: expected \" \"(321u) == (root.get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.get(\"bar\").as<uint>()"
               ,(char (*) [56])"failed: expected (321u) == (root.get(\"bar\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_708,(uint *)local_8a8,&local_528
              );
    DynamicValue::Builder::~Builder((Builder *)local_a60);
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
  StructBuilder::asReader(&local_ad8.builder);
  local_708 = (undefined1  [8])SVar1.super_Schema.raw;
  name_05.content.size_ = 4;
  name_05.content.ptr = "bar";
  DynamicStruct::Reader::get((Reader *)local_a60,(Reader *)local_708,name_05);
  local_8a8._4_4_ =
       DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_a60);
  local_8a8._0_4_ = 0x141;
  local_8a8._8_4_ = 0x4fd0ae;
  local_8a8._12_4_ = 0;
  local_8a8._16_4_ = 5;
  local_8a8._20_4_ = 0;
  local_8a8[0x18] = local_8a8._4_4_ == 0x141;
  DynamicValue::Reader::~Reader((Reader *)local_a60);
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
  if ((local_8a8[0x18] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_528 = 0x141;
    StructBuilder::asReader(&local_ad8.builder);
    local_708 = (undefined1  [8])SVar1.super_Schema.raw;
    name_06.content.size_ = 4;
    name_06.content.ptr = "bar";
    DynamicStruct::Reader::get((Reader *)local_a60,(Reader *)local_708,name_06);
    local_aa8.type =
         DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_a60);
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x170,ERROR,
               "\"failed: expected \" \"(321u) == (root.asReader().get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.asReader().get(\"bar\").as<uint>()"
               ,(char (*) [67])
                "failed: expected (321u) == (root.asReader().get(\"bar\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_8a8,&local_528,&local_aa8.type);
    DynamicValue::Reader::~Reader((Reader *)local_a60);
  }
  name_07.content.size_ = 4;
  name_07.content.ptr = "foo";
  DynamicStruct::Builder::get(&local_270,&local_ad8,name_07);
  DynamicValue::Builder::~Builder(&local_270);
  local_8a8._0_8_ = local_8a8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_708,(Maybe<kj::Exception> *)local_8a8);
  bVar4 = (bool)local_708[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_a60,(Maybe<kj::Exception> *)local_708);
  local_8c8 = (None *)&kj::none;
  local_8c0 = " != ";
  local_8b8 = 5;
  local_8b0 = bVar4;
  if ((bool)local_708[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_700);
  }
  if (local_8a8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8a8 + 8));
  }
  if ((local_8b0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x171,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"foo\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_a60);
  }
  if (local_a60[0] == true) {
    kj::Exception::~Exception((Exception *)(local_a60 + 8));
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
  StructBuilder::asReader(&local_ad8.builder);
  local_350.schema.super_Schema.raw = SVar1.super_Schema.raw;
  name_08.content.size_ = 4;
  name_08.content.ptr = "foo";
  DynamicStruct::Reader::get(&local_1b0,&local_350,name_08);
  DynamicValue::Reader::~Reader(&local_1b0);
  local_8a8._0_8_ = local_8a8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_708,(Maybe<kj::Exception> *)local_8a8);
  bVar4 = (bool)local_708[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_a60,(Maybe<kj::Exception> *)local_708);
  local_8c8 = (None *)&kj::none;
  local_8c0 = " != ";
  local_8b8 = 5;
  local_8b0 = bVar4;
  if ((bool)local_708[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_700);
  }
  if (local_8a8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8a8 + 8));
  }
  if ((local_8b0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x172,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [96])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"foo\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_a60);
  }
  if (local_a60[0] == true) {
    kj::Exception::~Exception((Exception *)(local_a60 + 8));
  }
  local_a60._0_4_ = 3;
  local_a60._8_4_ = 0x7b;
  local_a60._12_4_ = 0;
  name_34.content.size_ = 4;
  name_34.content.ptr = "foo";
  DynamicStruct::Builder::set(&local_ad8,name_34,(Reader *)local_a60);
  DynamicValue::Reader::~Reader((Reader *)local_a60);
  name_09.content.size_ = 4;
  name_09.content.ptr = "foo";
  uVar8 = 4;
  StructSchema::getFieldByName((Field *)local_8a8,&local_ae0,name_09);
  uVar3 = local_8a8._8_4_;
  uVar2 = local_8a8._0_8_;
  local_528 = local_8a8._12_4_;
  uStack_524 = local_8a8._16_4_;
  uStack_520 = local_8a8._20_4_;
  uStack_51c = local_8a8._24_4_;
  local_518._4_4_ = local_8a8._32_4_;
  local_518._0_4_ = local_8a8._28_4_;
  uStack_510._4_4_ = local_8a8._40_4_;
  uStack_510._0_4_ = local_8a8._36_4_;
  local_508 = (undefined7)CONCAT44(local_8a8._48_4_,local_8a8._44_4_);
  uStack_501 = SUB41(local_8a8._48_4_,3);
  uStack_500 = (undefined7)CONCAT44(local_8a8._56_4_,local_8a8._52_4_);
  uStack_4f9 = SUB41(local_8a8._56_4_,3);
  local_4f8 = local_8a8._60_4_;
  SVar6.raw = (RawBrandedSchema *)
              DynamicStruct::Builder::which
                        ((Maybe<capnp::StructSchema::Field> *)local_708,&local_ad8);
  if ((bool)local_708[0] == true) {
    local_aa8._4_4_ = auStack_700._16_4_;
    local_aa8.type = auStack_700._12_4_;
    local_aa8.field_1.intValue = CONCAT44(auStack_700._24_4_,auStack_700._20_4_);
    local_aa8.field_1.textValue.super_StringPtr.content.size_ =
         CONCAT44(auStack_700._32_4_,auStack_700._28_4_);
    local_aa8.field_1.capabilityValue.schema.super_Schema.raw =
         (InterfaceSchema)CONCAT44(auStack_700._40_4_,auStack_700._36_4_);
    local_aa8.field_1.listValue.reader.capTable =
         (CapTableReader *)CONCAT44(auStack_700._48_4_,auStack_700._44_4_);
    local_aa8.field_1.listValue.reader.ptr = (byte *)CONCAT44(auStack_700._56_4_,auStack_700._52_4_)
    ;
    local_aa8.field_1.listValue.reader.elementCount = auStack_700._60_4_;
    SVar6.raw = (RawBrandedSchema *)auStack_700._0_8_;
    uVar8 = auStack_700._8_4_;
  }
  if ((bool)local_708[0] == false) {
    local_570.type = UNKNOWN;
    local_570._4_4_ = 0;
    local_708 = (undefined1  [8])0x0;
    auStack_700._0_8_ = (Schema)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_570,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_570);
  }
  local_a60._124_4_ = local_aa8.field_1.listValue.reader.elementCount;
  local_a60._108_8_ = local_aa8.field_1.listValue.reader.capTable;
  local_a60._116_8_ = local_aa8.field_1.listValue.reader.ptr;
  local_a60._92_8_ = local_aa8.field_1.textValue.super_StringPtr.content.size_;
  local_a60._100_8_ = local_aa8.field_1.listValue.reader.segment;
  local_a60._76_8_ = local_aa8._0_8_;
  local_a60._84_8_ = local_aa8.field_1.intValue;
  local_a60._0_8_ = uVar2;
  local_a60._8_4_ = uVar3;
  local_a60[0x33] = uStack_501;
  local_a60._44_7_ = local_508;
  local_a60[0x3b] = uStack_4f9;
  local_a60._52_7_ = uStack_500;
  local_a60._12_4_ = local_528;
  local_a60._16_4_ = uStack_524;
  local_a60._20_4_ = uStack_520;
  local_a60._24_4_ = uStack_51c;
  local_a60._28_8_ = local_518;
  local_a60._36_8_ = uStack_510;
  local_a60._60_4_ = local_4f8;
  local_a60._128_8_ = " == ";
  local_a60._136_8_ = &DAT_00000005;
  local_a60[0x90] = uVar3 == uVar8 && (RawBrandedSchema *)uVar2 == SVar6.raw;
  local_a60._64_8_ = SVar6.raw;
  local_a60._72_4_ = uVar8;
  if ((uVar3 != uVar8 || (RawBrandedSchema *)uVar2 != SVar6.raw) && (kj::_::Debug::minSeverity < 3))
  {
    name_10.content.size_ = 4;
    name_10.content.ptr = "foo";
    StructSchema::getFieldByName((Field *)&local_aa8,&local_ae0,name_10);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8a8,&local_ad8);
    if (local_8a8[0] != true) {
      local_570.type = UNKNOWN;
      local_570._4_4_ = 0;
      local_8a8._0_8_ = (RawBrandedSchema *)0x0;
      local_8a8._8_4_ = 0;
      local_8a8._12_4_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_570,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_570);
    }
    auStack_700._4_4_ = local_8a8._12_4_;
    auStack_700._0_4_ = local_8a8._8_4_;
    pAStack_4e9 = (ArrayDisposer *)local_8a8._64_8_;
    uStack_501 = (undefined1)local_8a8._40_4_;
    uStack_500 = (undefined7)(CONCAT44(local_8a8._44_4_,local_8a8._40_4_) >> 8);
    uStack_4f9 = (undefined1)local_8a8._48_4_;
    local_4f8 = (undefined4)(CONCAT44(local_8a8._52_4_,local_8a8._48_4_) >> 8);
    uStack_4f4 = SUB43(local_8a8._52_4_,1);
    local_708[0] = 1;
    auStack_700._8_4_ = local_8a8._16_4_;
    auStack_700._12_4_ = local_8a8._20_4_;
    auStack_700._16_4_ = local_8a8._24_4_;
    auStack_700._20_4_ = local_8a8._28_4_;
    auStack_700._24_4_ = local_8a8._32_4_;
    auStack_700._28_4_ = local_8a8._36_4_;
    auStack_700._32_4_ = local_8a8._40_4_;
    auStack_700._36_4_ = local_8a8._44_4_;
    auStack_700._40_4_ = local_8a8._48_4_;
    auStack_700._44_4_ = local_8a8._52_4_;
    auStack_700._48_4_ = local_8a8._56_4_;
    auStack_700._52_4_ = local_8a8._60_4_;
    auStack_700._56_4_ = (undefined4)local_8a8._64_8_;
    auStack_700._60_4_ = SUB84(local_8a8._64_8_,4);
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x175,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 373, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 373, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 373, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_a60
               ,(Field *)&local_aa8,(Field *)auStack_700);
  }
  name_11.content.size_ = 4;
  name_11.content.ptr = "foo";
  DynamicStruct::Builder::get((Builder *)local_a60,&local_ad8,name_11);
  local_708._4_4_ =
       DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)local_a60);
  local_708._0_4_ = 0x7b;
  auStack_700._0_8_ = " == ";
  auStack_700._8_4_ = 5;
  auStack_700._12_4_ = 0;
  auStack_700[0x10] = local_708._4_4_ == 0x7b;
  DynamicValue::Builder::~Builder((Builder *)local_a60);
  if ((auStack_700[0x10] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_8a8._0_4_ = 0x7b;
    name_12.content.size_ = 4;
    name_12.content.ptr = "foo";
    DynamicStruct::Builder::get((Builder *)local_a60,&local_ad8,name_12);
    local_528 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                          ((Builder *)local_a60);
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x176,ERROR,
               "\"failed: expected \" \"(123u) == (root.get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.get(\"foo\").as<uint>()"
               ,(char (*) [56])"failed: expected (123u) == (root.get(\"foo\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_708,(uint *)local_8a8,&local_528
              );
    DynamicValue::Builder::~Builder((Builder *)local_a60);
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
  StructBuilder::asReader(&local_ad8.builder);
  local_708 = (undefined1  [8])SVar1.super_Schema.raw;
  name_13.content.size_ = 4;
  name_13.content.ptr = "foo";
  DynamicStruct::Reader::get((Reader *)local_a60,(Reader *)local_708,name_13);
  local_8a8._4_4_ =
       DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_a60);
  local_8a8._0_4_ = 0x7b;
  local_8a8._8_4_ = 0x4fd0ae;
  local_8a8._12_4_ = 0;
  local_8a8._16_4_ = 5;
  local_8a8._20_4_ = 0;
  local_8a8[0x18] = local_8a8._4_4_ == 0x7b;
  DynamicValue::Reader::~Reader((Reader *)local_a60);
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
  if ((local_8a8[0x18] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_528 = 0x7b;
    StructBuilder::asReader(&local_ad8.builder);
    local_708 = (undefined1  [8])SVar1.super_Schema.raw;
    name_14.content.size_ = 4;
    name_14.content.ptr = "foo";
    DynamicStruct::Reader::get((Reader *)local_a60,(Reader *)local_708,name_14);
    TVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_a60);
    local_aa8.type = TVar5;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x177,ERROR,
               "\"failed: expected \" \"(123u) == (root.asReader().get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.asReader().get(\"foo\").as<uint>()"
               ,(char (*) [67])
                "failed: expected (123u) == (root.asReader().get(\"foo\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_8a8,&local_528,&local_aa8.type);
    DynamicValue::Reader::~Reader((Reader *)local_a60);
  }
  name_15.content.size_ = 4;
  name_15.content.ptr = "bar";
  DynamicStruct::Builder::get(&local_230,&local_ad8,name_15);
  DynamicValue::Builder::~Builder(&local_230);
  local_8a8._0_8_ = local_8a8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_708,(Maybe<kj::Exception> *)local_8a8);
  bVar4 = (bool)local_708[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_a60,(Maybe<kj::Exception> *)local_708);
  local_8c8 = (None *)&kj::none;
  local_8c0 = " != ";
  local_8b8 = 5;
  local_8b0 = bVar4;
  if ((bool)local_708[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_700);
  }
  if (local_8a8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8a8 + 8));
  }
  if ((local_8b0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x178,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"bar\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_a60);
  }
  if (local_a60[0] == true) {
    kj::Exception::~Exception((Exception *)(local_a60 + 8));
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
  StructBuilder::asReader(&local_ad8.builder);
  local_318.schema.super_Schema.raw = SVar1.super_Schema.raw;
  name_16.content.size_ = 4;
  name_16.content.ptr = "bar";
  DynamicStruct::Reader::get(&local_168,&local_318,name_16);
  DynamicValue::Reader::~Reader(&local_168);
  local_8a8._0_8_ = local_8a8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_708,(Maybe<kj::Exception> *)local_8a8);
  bVar4 = (bool)local_708[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_a60,(Maybe<kj::Exception> *)local_708);
  local_8c8 = (None *)&kj::none;
  local_8c0 = " != ";
  local_8b8 = 5;
  local_8b0 = bVar4;
  if ((bool)local_708[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_700);
  }
  if (local_8a8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8a8 + 8));
  }
  if ((local_8b0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x179,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [96])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"bar\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_a60);
  }
  if (local_a60[0] == true) {
    kj::Exception::~Exception((Exception *)(local_a60 + 8));
  }
  local_a60._0_4_ = 3;
  local_a60._8_4_ = 0x141;
  local_a60._12_4_ = 0;
  name_35.content.size_ = 4;
  name_35.content.ptr = "bar";
  DynamicStruct::Builder::set(&local_ad8,name_35,(Reader *)local_a60);
  DynamicValue::Reader::~Reader((Reader *)local_a60);
  name_17.content.size_ = 4;
  name_17.content.ptr = "bar";
  SVar6.raw = (RawBrandedSchema *)&DAT_00000004;
  StructSchema::getFieldByName((Field *)local_8a8,&local_ae0,name_17);
  uVar3 = local_8a8._8_4_;
  uVar2 = local_8a8._0_8_;
  local_528 = local_8a8._12_4_;
  uStack_524 = local_8a8._16_4_;
  uStack_520 = local_8a8._20_4_;
  uStack_51c = local_8a8._24_4_;
  local_518._4_4_ = local_8a8._32_4_;
  local_518._0_4_ = local_8a8._28_4_;
  uStack_510._4_4_ = local_8a8._40_4_;
  uStack_510._0_4_ = local_8a8._36_4_;
  local_508 = (undefined7)CONCAT44(local_8a8._48_4_,local_8a8._44_4_);
  uStack_501 = SUB41(local_8a8._48_4_,3);
  uStack_500 = (undefined7)CONCAT44(local_8a8._56_4_,local_8a8._52_4_);
  uStack_4f9 = SUB41(local_8a8._56_4_,3);
  local_4f8 = local_8a8._60_4_;
  pMVar7 = DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_708,&local_ad8);
  uVar8 = (uint)pMVar7;
  if ((bool)local_708[0] == true) {
    local_aa8._4_4_ = auStack_700._16_4_;
    local_aa8.type = auStack_700._12_4_;
    local_aa8.field_1.intValue = CONCAT44(auStack_700._24_4_,auStack_700._20_4_);
    local_aa8.field_1.textValue.super_StringPtr.content.size_ =
         CONCAT44(auStack_700._32_4_,auStack_700._28_4_);
    local_aa8.field_1.capabilityValue.schema.super_Schema.raw =
         (InterfaceSchema)CONCAT44(auStack_700._40_4_,auStack_700._36_4_);
    local_aa8.field_1.listValue.reader.capTable =
         (CapTableReader *)CONCAT44(auStack_700._48_4_,auStack_700._44_4_);
    local_aa8.field_1.listValue.reader.ptr = (byte *)CONCAT44(auStack_700._56_4_,auStack_700._52_4_)
    ;
    local_aa8.field_1.listValue.reader.elementCount = auStack_700._60_4_;
    SVar6.raw = (RawBrandedSchema *)auStack_700._0_8_;
    uVar8 = auStack_700._8_4_;
  }
  if ((bool)local_708[0] != false) {
    local_a60._124_4_ = local_aa8.field_1.listValue.reader.elementCount;
    local_a60._108_8_ = local_aa8.field_1.listValue.reader.capTable;
    local_a60._116_8_ = local_aa8.field_1.listValue.reader.ptr;
    local_a60._92_8_ = local_aa8.field_1.textValue.super_StringPtr.content.size_;
    local_a60._100_8_ = local_aa8.field_1.listValue.reader.segment;
    local_a60._76_8_ = local_aa8._0_8_;
    local_a60._84_8_ = local_aa8.field_1.intValue;
    local_a60._0_8_ = uVar2;
    local_a60._8_4_ = uVar3;
    local_a60[0x33] = uStack_501;
    local_a60._44_7_ = local_508;
    local_a60[0x3b] = uStack_4f9;
    local_a60._52_7_ = uStack_500;
    local_a60._12_4_ = local_528;
    local_a60._16_4_ = uStack_524;
    local_a60._20_4_ = uStack_520;
    local_a60._24_4_ = uStack_51c;
    local_a60._28_8_ = local_518;
    local_a60._36_8_ = uStack_510;
    local_a60._60_4_ = local_4f8;
    local_a60._128_8_ = " == ";
    local_a60._136_8_ = &DAT_00000005;
    local_a60[0x90] = uVar3 == uVar8 && (RawBrandedSchema *)uVar2 == SVar6.raw;
    local_a60._64_8_ = SVar6.raw;
    local_a60._72_4_ = uVar8;
    if ((uVar3 != uVar8 || (RawBrandedSchema *)uVar2 != SVar6.raw) &&
       (kj::_::Debug::minSeverity < 3)) {
      name_18.content.size_ = 4;
      name_18.content.ptr = "bar";
      StructSchema::getFieldByName((Field *)&local_aa8,&local_ae0,name_18);
      DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8a8,&local_ad8);
      if (local_8a8[0] != true) {
        local_570.type = UNKNOWN;
        local_570._4_4_ = 0;
        local_8a8._0_8_ = (RawBrandedSchema *)0x0;
        local_8a8._8_4_ = 0;
        local_8a8._12_4_ = 0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_570,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_570);
      }
      auStack_700._4_4_ = local_8a8._12_4_;
      auStack_700._0_4_ = local_8a8._8_4_;
      pAStack_4e9 = (ArrayDisposer *)local_8a8._64_8_;
      uStack_501 = (undefined1)local_8a8._40_4_;
      uStack_500 = (undefined7)(CONCAT44(local_8a8._44_4_,local_8a8._40_4_) >> 8);
      uStack_4f9 = (undefined1)local_8a8._48_4_;
      local_4f8 = (undefined4)(CONCAT44(local_8a8._52_4_,local_8a8._48_4_) >> 8);
      uStack_4f4 = SUB43(local_8a8._52_4_,1);
      local_708[0] = 1;
      auStack_700._8_4_ = local_8a8._16_4_;
      auStack_700._12_4_ = local_8a8._20_4_;
      auStack_700._16_4_ = local_8a8._24_4_;
      auStack_700._20_4_ = local_8a8._28_4_;
      auStack_700._24_4_ = local_8a8._32_4_;
      auStack_700._28_4_ = local_8a8._36_4_;
      auStack_700._32_4_ = local_8a8._40_4_;
      auStack_700._36_4_ = local_8a8._44_4_;
      auStack_700._40_4_ = local_8a8._48_4_;
      auStack_700._44_4_ = local_8a8._52_4_;
      auStack_700._48_4_ = local_8a8._56_4_;
      auStack_700._52_4_ = local_8a8._60_4_;
      auStack_700._56_4_ = (undefined4)local_8a8._64_8_;
      auStack_700._60_4_ = SUB84(local_8a8._64_8_,4);
      kj::_::Debug::
      log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x17c,ERROR,
                 "\"failed: expected \" \"(schema.getFieldByName(\\\"bar\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 380, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"bar\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 380, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [387])
                  "failed: expected (schema.getFieldByName(\"bar\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 380, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                  local_a60,(Field *)&local_aa8,(Field *)auStack_700);
    }
    name_19.content.size_ = 4;
    name_19.content.ptr = "bar";
    DynamicStruct::Builder::get((Builder *)local_a60,&local_ad8,name_19);
    local_708._4_4_ =
         DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)local_a60);
    local_708._0_4_ = 0x141;
    auStack_700._0_8_ = " == ";
    auStack_700._8_4_ = 5;
    auStack_700._12_4_ = 0;
    auStack_700[0x10] = local_708._4_4_ == 0x141;
    DynamicValue::Builder::~Builder((Builder *)local_a60);
    if ((auStack_700[0x10] == '\0') && (kj::_::Debug::minSeverity < 3)) {
      local_8a8._0_4_ = 0x141;
      name_20.content.size_ = 4;
      name_20.content.ptr = "bar";
      DynamicStruct::Builder::get((Builder *)local_a60,&local_ad8,name_20);
      local_528 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                            ((Builder *)local_a60);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x17d,ERROR,
                 "\"failed: expected \" \"(321u) == (root.get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.get(\"bar\").as<uint>()"
                 ,(char (*) [56])"failed: expected (321u) == (root.get(\"bar\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_708,(uint *)local_8a8,
                 &local_528);
      DynamicValue::Builder::~Builder((Builder *)local_a60);
    }
    SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
    StructBuilder::asReader(&local_ad8.builder);
    local_708 = (undefined1  [8])SVar1.super_Schema.raw;
    name_21.content.size_ = 4;
    name_21.content.ptr = "bar";
    DynamicStruct::Reader::get((Reader *)local_a60,(Reader *)local_708,name_21);
    local_8a8._4_4_ =
         DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_a60);
    local_8a8._0_4_ = 0x141;
    local_8a8._8_4_ = 0x4fd0ae;
    local_8a8._12_4_ = 0;
    local_8a8._16_4_ = 5;
    local_8a8._20_4_ = 0;
    local_8a8[0x18] = local_8a8._4_4_ == 0x141;
    DynamicValue::Reader::~Reader((Reader *)local_a60);
    SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
    if ((local_8a8[0x18] == '\0') && (kj::_::Debug::minSeverity < 3)) {
      local_528 = 0x141;
      StructBuilder::asReader(&local_ad8.builder);
      local_708 = (undefined1  [8])SVar1.super_Schema.raw;
      name_22.content.size_ = 4;
      name_22.content.ptr = "bar";
      DynamicStruct::Reader::get((Reader *)local_a60,(Reader *)local_708,name_22);
      TVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_a60)
      ;
      local_aa8.type = TVar5;
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x17e,ERROR,
                 "\"failed: expected \" \"(321u) == (root.asReader().get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.asReader().get(\"bar\").as<uint>()"
                 ,(char (*) [67])
                  "failed: expected (321u) == (root.asReader().get(\"bar\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_8a8,&local_528,&local_aa8.type
                );
      DynamicValue::Reader::~Reader((Reader *)local_a60);
    }
    name_23.content.size_ = 4;
    name_23.content.ptr = "foo";
    DynamicStruct::Builder::get(&local_1f0,&local_ad8,name_23);
    DynamicValue::Builder::~Builder(&local_1f0);
    local_8a8._0_8_ = local_8a8._0_8_ & 0xffffffffffffff00;
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)local_708,(Maybe<kj::Exception> *)local_8a8);
    bVar4 = (bool)local_708[0];
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)local_a60,(Maybe<kj::Exception> *)local_708);
    local_8c8 = (None *)&kj::none;
    local_8c0 = " != ";
    local_8b8 = 5;
    local_8b0 = bVar4;
    if ((bool)local_708[0] == true) {
      kj::Exception::~Exception((Exception *)auStack_700);
    }
    if (local_8a8[0] == true) {
      kj::Exception::~Exception((Exception *)(local_8a8 + 8));
    }
    if ((local_8b0 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x17f,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"foo\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_a60);
    }
    if (local_a60[0] == true) {
      kj::Exception::~Exception((Exception *)(local_a60 + 8));
    }
    SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
    StructBuilder::asReader(&local_ad8.builder);
    local_2e0.schema.super_Schema.raw = SVar1.super_Schema.raw;
    name_24.content.size_ = 4;
    name_24.content.ptr = "foo";
    DynamicStruct::Reader::get(&local_570,&local_2e0,name_24);
    DynamicValue::Reader::~Reader(&local_570);
    local_8a8._0_8_ = local_8a8._0_8_ & 0xffffffffffffff00;
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)local_708,(Maybe<kj::Exception> *)local_8a8);
    bVar4 = (bool)local_708[0];
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)local_a60,(Maybe<kj::Exception> *)local_708);
    local_8c8 = (None *)&kj::none;
    local_8c0 = " != ";
    local_8b8 = 5;
    local_8b0 = bVar4;
    if ((bool)local_708[0] == true) {
      kj::Exception::~Exception((Exception *)auStack_700);
    }
    if (local_8a8[0] == true) {
      kj::Exception::~Exception((Exception *)(local_8a8 + 8));
    }
    if ((local_8b0 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x180,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [96])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"foo\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_a60);
    }
    if (local_a60[0] == true) {
      kj::Exception::~Exception((Exception *)(local_a60 + 8));
    }
    local_a60._0_4_ = 3;
    local_a60._8_4_ = 0x7b;
    local_a60._12_4_ = 0;
    name_36.content.size_ = 4;
    name_36.content.ptr = "foo";
    DynamicStruct::Builder::set(&local_ad8,name_36,(Reader *)local_a60);
    DynamicValue::Reader::~Reader((Reader *)local_a60);
    name_25.content.size_ = 4;
    name_25.content.ptr = "foo";
    SVar6.raw = (RawBrandedSchema *)&DAT_00000004;
    StructSchema::getFieldByName((Field *)local_8a8,&local_ae0,name_25);
    uVar3 = local_8a8._8_4_;
    uVar2 = local_8a8._0_8_;
    local_528 = local_8a8._12_4_;
    uStack_524 = local_8a8._16_4_;
    uStack_520 = local_8a8._20_4_;
    uStack_51c = local_8a8._24_4_;
    local_518._4_4_ = local_8a8._32_4_;
    local_518._0_4_ = local_8a8._28_4_;
    uStack_510._4_4_ = local_8a8._40_4_;
    uStack_510._0_4_ = local_8a8._36_4_;
    local_508 = (undefined7)CONCAT44(local_8a8._48_4_,local_8a8._44_4_);
    uStack_501 = SUB41(local_8a8._48_4_,3);
    uStack_500 = (undefined7)CONCAT44(local_8a8._56_4_,local_8a8._52_4_);
    uStack_4f9 = SUB41(local_8a8._56_4_,3);
    local_4f8 = local_8a8._60_4_;
    pMVar7 = DynamicStruct::Builder::which
                       ((Maybe<capnp::StructSchema::Field> *)local_708,&local_ad8);
    uVar8 = (uint)pMVar7;
    if ((bool)local_708[0] == true) {
      local_aa8._4_4_ = auStack_700._16_4_;
      local_aa8.type = auStack_700._12_4_;
      local_aa8.field_1.intValue = CONCAT44(auStack_700._24_4_,auStack_700._20_4_);
      local_aa8.field_1.textValue.super_StringPtr.content.size_ =
           CONCAT44(auStack_700._32_4_,auStack_700._28_4_);
      local_aa8.field_1.capabilityValue.schema.super_Schema.raw =
           (InterfaceSchema)CONCAT44(auStack_700._40_4_,auStack_700._36_4_);
      local_aa8.field_1.listValue.reader.capTable =
           (CapTableReader *)CONCAT44(auStack_700._48_4_,auStack_700._44_4_);
      local_aa8.field_1.listValue.reader.ptr =
           (byte *)CONCAT44(auStack_700._56_4_,auStack_700._52_4_);
      local_aa8.field_1.listValue.reader.elementCount = auStack_700._60_4_;
      SVar6.raw = (RawBrandedSchema *)auStack_700._0_8_;
      uVar8 = auStack_700._8_4_;
    }
    if ((bool)local_708[0] != false) {
      local_a60._124_4_ = local_aa8.field_1.listValue.reader.elementCount;
      local_a60._108_8_ = local_aa8.field_1.listValue.reader.capTable;
      local_a60._116_8_ = local_aa8.field_1.listValue.reader.ptr;
      local_a60._92_8_ = local_aa8.field_1.textValue.super_StringPtr.content.size_;
      local_a60._100_8_ = local_aa8.field_1.listValue.reader.segment;
      local_a60._76_8_ = local_aa8._0_8_;
      local_a60._84_8_ = local_aa8.field_1.intValue;
      local_a60._0_8_ = uVar2;
      local_a60._8_4_ = uVar3;
      local_a60[0x33] = uStack_501;
      local_a60._44_7_ = local_508;
      local_a60[0x3b] = uStack_4f9;
      local_a60._52_7_ = uStack_500;
      local_a60._12_4_ = local_528;
      local_a60._16_4_ = uStack_524;
      local_a60._20_4_ = uStack_520;
      local_a60._24_4_ = uStack_51c;
      local_a60._28_8_ = local_518;
      local_a60._36_8_ = uStack_510;
      local_a60._60_4_ = local_4f8;
      local_a60._128_8_ = " == ";
      local_a60._136_8_ = &DAT_00000005;
      local_a60[0x90] = uVar3 == uVar8 && (RawBrandedSchema *)uVar2 == SVar6.raw;
      local_a60._64_8_ = SVar6.raw;
      local_a60._72_4_ = uVar8;
      if ((uVar3 != uVar8 || (RawBrandedSchema *)uVar2 != SVar6.raw) &&
         (kj::_::Debug::minSeverity < 3)) {
        name_26.content.size_ = 4;
        name_26.content.ptr = "foo";
        StructSchema::getFieldByName((Field *)&local_aa8,&local_ae0,name_26);
        DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8a8,&local_ad8);
        if (local_8a8[0] != true) {
          local_390.type = UNKNOWN;
          local_390._4_4_ = 0;
          local_8a8._0_8_ = (RawBrandedSchema *)0x0;
          local_8a8._8_4_ = 0;
          local_8a8._12_4_ = 0;
          kj::_::Debug::Fault::init
                    ((Fault *)&local_390,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)&local_390);
        }
        auStack_700._4_4_ = local_8a8._12_4_;
        auStack_700._0_4_ = local_8a8._8_4_;
        pAStack_4e9 = (ArrayDisposer *)local_8a8._64_8_;
        uStack_501 = (undefined1)local_8a8._40_4_;
        uStack_500 = (undefined7)(CONCAT44(local_8a8._44_4_,local_8a8._40_4_) >> 8);
        uStack_4f9 = (undefined1)local_8a8._48_4_;
        local_4f8 = (undefined4)(CONCAT44(local_8a8._52_4_,local_8a8._48_4_) >> 8);
        uStack_4f4 = SUB43(local_8a8._52_4_,1);
        local_708[0] = 1;
        auStack_700._8_4_ = local_8a8._16_4_;
        auStack_700._12_4_ = local_8a8._20_4_;
        auStack_700._16_4_ = local_8a8._24_4_;
        auStack_700._56_4_ = (undefined4)local_8a8._64_8_;
        auStack_700._60_4_ = SUB84(local_8a8._64_8_,4);
        kj::_::Debug::
        log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x183,ERROR,
                   "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 387, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 387, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                   ,(char (*) [387])
                    "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 387, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                   ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                    local_a60,(Field *)&local_aa8,(Field *)auStack_700);
      }
      name_27.content.size_ = 4;
      name_27.content.ptr = "foo";
      DynamicStruct::Builder::get((Builder *)local_a60,&local_ad8,name_27);
      local_708._4_4_ =
           DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)local_a60);
      local_708._0_4_ = 0x7b;
      auStack_700._0_8_ = " == ";
      auStack_700._8_4_ = 5;
      auStack_700._12_4_ = 0;
      auStack_700[0x10] = local_708._4_4_ == 0x7b;
      DynamicValue::Builder::~Builder((Builder *)local_a60);
      if ((auStack_700[0x10] == '\0') && (kj::_::Debug::minSeverity < 3)) {
        local_8a8._0_4_ = 0x7b;
        name_28.content.size_ = 4;
        name_28.content.ptr = "foo";
        DynamicStruct::Builder::get((Builder *)local_a60,&local_ad8,name_28);
        local_528 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                              ((Builder *)local_a60);
        kj::_::Debug::
        log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x184,ERROR,
                   "\"failed: expected \" \"(123u) == (root.get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.get(\"foo\").as<uint>()"
                   ,(char (*) [56])"failed: expected (123u) == (root.get(\"foo\").as<uint>())",
                   (DebugComparison<unsigned_int,_unsigned_int> *)local_708,(uint *)local_8a8,
                   &local_528);
        DynamicValue::Builder::~Builder((Builder *)local_a60);
      }
      SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
      StructBuilder::asReader(&local_ad8.builder);
      local_708 = (undefined1  [8])SVar1.super_Schema.raw;
      name_29.content.size_ = 4;
      name_29.content.ptr = "foo";
      DynamicStruct::Reader::get((Reader *)local_a60,(Reader *)local_708,name_29);
      local_8a8._4_4_ =
           DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_a60);
      local_8a8._0_4_ = 0x7b;
      local_8a8._8_4_ = 0x4fd0ae;
      local_8a8._12_4_ = 0;
      local_8a8._16_4_ = 5;
      local_8a8._20_4_ = 0;
      local_8a8[0x18] = local_8a8._4_4_ == 0x7b;
      DynamicValue::Reader::~Reader((Reader *)local_a60);
      SVar1.super_Schema.raw = (Schema)(Schema)local_ad8.schema;
      if ((local_8a8[0x18] == '\0') && (kj::_::Debug::minSeverity < 3)) {
        local_528 = 0x7b;
        StructBuilder::asReader(&local_ad8.builder);
        local_708 = (undefined1  [8])SVar1.super_Schema.raw;
        name_30.content.size_ = 4;
        name_30.content.ptr = "foo";
        DynamicStruct::Reader::get((Reader *)local_a60,(Reader *)local_708,name_30);
        TVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                          ((Reader *)local_a60);
        local_aa8.type = TVar5;
        kj::_::Debug::
        log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x185,ERROR,
                   "\"failed: expected \" \"(123u) == (root.asReader().get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.asReader().get(\"foo\").as<uint>()"
                   ,(char (*) [67])
                    "failed: expected (123u) == (root.asReader().get(\"foo\").as<uint>())",
                   (DebugComparison<unsigned_int,_unsigned_int> *)local_8a8,&local_528,
                   &local_aa8.type);
        DynamicValue::Reader::~Reader((Reader *)local_a60);
      }
      name_31.content.size_ = 4;
      name_31.content.ptr = "bar";
      DynamicStruct::Builder::get(&local_390,&local_ad8,name_31);
      DynamicValue::Builder::~Builder(&local_390);
      local_8a8._0_8_ = local_8a8._0_8_ & 0xffffffffffffff00;
      kj::Maybe<kj::Exception>::Maybe
                ((Maybe<kj::Exception> *)local_708,(Maybe<kj::Exception> *)local_8a8);
      bVar4 = (bool)local_708[0];
      kj::Maybe<kj::Exception>::Maybe
                ((Maybe<kj::Exception> *)local_a60,(Maybe<kj::Exception> *)local_708);
      local_8c8 = (None *)&kj::none;
      local_8c0 = " != ";
      local_8b8 = 5;
      local_8b0 = bVar4;
      if ((bool)local_708[0] == true) {
        kj::Exception::~Exception((Exception *)auStack_700);
      }
      if (local_8a8[0] == true) {
        kj::Exception::~Exception((Exception *)(local_8a8 + 8));
      }
      if ((local_8b0 == false) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::
        log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x186,ERROR,
                   "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                   ,(char (*) [85])
                    "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"bar\"); }) != kj::none"
                   ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_a60);
      }
      if (local_a60[0] == true) {
        kj::Exception::~Exception((Exception *)(local_a60 + 8));
      }
      StructBuilder::asReader(&local_ad8.builder);
      local_2a8.schema.super_Schema.raw = local_ad8.schema.super_Schema.raw;
      name_32.content.size_ = 4;
      name_32.content.ptr = "bar";
      DynamicStruct::Reader::get(&local_aa8,&local_2a8,name_32);
      DynamicValue::Reader::~Reader(&local_aa8);
      local_8a8._0_8_ = local_8a8._0_8_ & 0xffffffffffffff00;
      kj::Maybe<kj::Exception>::Maybe
                ((Maybe<kj::Exception> *)local_708,(Maybe<kj::Exception> *)local_8a8);
      bVar4 = (bool)local_708[0];
      kj::Maybe<kj::Exception>::Maybe
                ((Maybe<kj::Exception> *)local_a60,(Maybe<kj::Exception> *)local_708);
      local_8c8 = (None *)&kj::none;
      local_8c0 = " != ";
      local_8b8 = 5;
      local_8b0 = bVar4;
      if ((bool)local_708[0] == true) {
        kj::Exception::~Exception((Exception *)auStack_700);
      }
      if (local_8a8[0] == true) {
        kj::Exception::~Exception((Exception *)(local_8a8 + 8));
      }
      if ((local_8b0 == false) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::
        log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x187,ERROR,
                   "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                   ,(char (*) [96])
                    "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"bar\"); }) != kj::none"
                   ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_a60);
      }
      if (local_a60[0] == true) {
        kj::Exception::~Exception((Exception *)(local_a60 + 8));
      }
      MallocMessageBuilder::~MallocMessageBuilder(&local_120);
      return;
    }
    local_390.type = UNKNOWN;
    local_390._4_4_ = 0;
    local_708 = (undefined1  [8])0x0;
    auStack_700._0_8_ = (Schema)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_390,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_390);
  }
  local_570.type = UNKNOWN;
  local_570._4_4_ = 0;
  local_708 = (undefined1  [8])0x0;
  auStack_700._0_8_ = (Schema)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_570,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_570);
}

Assistant:

TEST(DynamicApi, UnnamedUnion) {
  MallocMessageBuilder builder;
  StructSchema schema = Schema::from<test::TestUnnamedUnion>();
  auto root = builder.initRoot<DynamicStruct>(schema);

  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));

  root.set("bar", 321);
  EXPECT_EQ(schema.getFieldByName("bar"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(321u, root.get("bar").as<uint>());
  EXPECT_EQ(321u, root.asReader().get("bar").as<uint>());
  EXPECT_ANY_THROW(root.get("foo"));
  EXPECT_ANY_THROW(root.asReader().get("foo"));

  root.set("foo", 123);
  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(123u, root.get("foo").as<uint>());
  EXPECT_EQ(123u, root.asReader().get("foo").as<uint>());
  EXPECT_ANY_THROW(root.get("bar"));
  EXPECT_ANY_THROW(root.asReader().get("bar"));

  root.set("bar", 321);
  EXPECT_EQ(schema.getFieldByName("bar"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(321u, root.get("bar").as<uint>());
  EXPECT_EQ(321u, root.asReader().get("bar").as<uint>());
  EXPECT_ANY_THROW(root.get("foo"));
  EXPECT_ANY_THROW(root.asReader().get("foo"));

  root.set("foo", 123);
  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(123u, root.get("foo").as<uint>());
  EXPECT_EQ(123u, root.asReader().get("foo").as<uint>());
  EXPECT_ANY_THROW(root.get("bar"));
  EXPECT_ANY_THROW(root.asReader().get("bar"));
}